

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O1

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  int iVar1;
  uint uVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar3;
  secp256k1_scalar *psVar4;
  secp256k1_gej *a;
  secp256k1_scalar *ng;
  ulong uVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  secp256k1_scalar ens;
  size_t size;
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  secp256k1_strauss_point_state ps [1];
  uint32_t epos;
  uint32_t ring;
  secp256k1_fe zr [8];
  int local_e48;
  uint local_e44;
  long local_e40;
  size_t local_e38;
  secp256k1_scalar *local_e30;
  secp256k1_scalar local_e28;
  uchar *local_e08;
  secp256k1_scalar *local_e00;
  secp256k1_gej *local_df8;
  secp256k1_ecmult_context *local_df0;
  secp256k1_scalar *local_de8;
  size_t local_de0;
  secp256k1_strauss_state local_dd8;
  uchar local_db8;
  uchar uStack_db7;
  uchar uStack_db6;
  uchar uStack_db5;
  uchar uStack_db4;
  uchar uStack_db3;
  uchar uStack_db2;
  uchar uStack_db1;
  uchar uStack_db0;
  uchar uStack_daf;
  uchar uStack_dae;
  uchar uStack_dad;
  uchar uStack_dac;
  uchar uStack_dab;
  uchar uStack_daa;
  uchar uStack_da9;
  uchar local_da8;
  uchar uStack_da7;
  uchar uStack_da6;
  uchar uStack_da5;
  uchar uStack_da4;
  uchar uStack_da3;
  uchar uStack_da2;
  uchar uStack_da1;
  uchar uStack_da0;
  uchar uStack_d9f;
  uchar uStack_d9e;
  uchar uStack_d9d;
  uchar uStack_d9c;
  uchar uStack_d9b;
  uchar uStack_d9a;
  uchar uStack_d99;
  secp256k1_sha256 local_d88;
  secp256k1_gej local_d20;
  secp256k1_ge local_ca0;
  secp256k1_strauss_point_state local_c48;
  secp256k1_ge local_838 [8];
  secp256k1_gej local_578 [8];
  secp256k1_fe local_178 [8];
  
  local_d88.s[0] = 0x6a09e667;
  local_d88.s[1] = 0xbb67ae85;
  local_d88.s[2] = 0x3c6ef372;
  local_d88.s[3] = 0xa54ff53a;
  local_d88.s[4] = 0x510e527f;
  local_d88.s[5] = 0x9b05688c;
  local_d88.s[6] = 0x1f83d9ab;
  local_d88.s[7] = 0x5be0cd19;
  local_d88.bytes = 0;
  local_e30 = evalues;
  local_e00 = s;
  local_df8 = pubs;
  local_df0 = ecmult_ctx;
  if (nrings != 0) {
    local_e40 = 0;
    sVar6 = 0;
    local_e08 = e0;
    do {
      local_c48.wnaf_na[0] = 0x6a09e667;
      local_c48.wnaf_na[1] = -0x4498517b;
      local_c48.wnaf_na[2] = 0x3c6ef372;
      local_c48.wnaf_na[3] = -0x5ab00ac6;
      local_c48.wnaf_na[4] = 0x510e527f;
      local_c48.wnaf_na[5] = -0x64fa9774;
      local_c48.wnaf_na[6] = 0x1f83d9ab;
      local_c48.wnaf_na[7] = 0x5be0cd19;
      local_c48.wnaf_na[0x18] = 0;
      local_c48.wnaf_na[0x19] = 0;
      uVar2 = (uint)sVar6;
      local_e44 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      local_838[0].x.n[0]._0_4_ = 0;
      local_578[0].x.n[0]._0_4_ = local_e44;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,e0,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_578,4);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,&local_db8);
      secp256k1_scalar_set_b32(&local_e28,&local_db8,&local_e48);
      local_e38 = sVar6;
      if (rsizes[sVar6] != 0) {
        ng = local_e00 + local_e40;
        a = local_df8 + local_e40;
        psVar4 = local_e30 + local_e40;
        uVar5 = 0;
        uVar3 = extraout_RAX;
        do {
          local_dd8.prej = local_578;
          if (local_e48 != 0) {
            return 0;
          }
          auVar8._0_4_ = -(uint)((int)ng->d[2] == 0 && (int)ng->d[0] == 0);
          auVar8._4_4_ = -(uint)(*(int *)((long)ng->d + 0x14) == 0 && *(int *)((long)ng->d + 4) == 0
                                );
          auVar8._8_4_ = -(uint)((int)ng->d[3] == 0 && (int)ng->d[1] == 0);
          auVar8._12_4_ =
               -(uint)(*(int *)((long)ng->d + 0x1c) == 0 && *(int *)((long)ng->d + 0xc) == 0);
          iVar1 = movmskps((int)uVar3,auVar8);
          if (iVar1 == 0xf) {
            return 0;
          }
          if ((local_e28.d[3] == 0 && local_e28.d[1] == 0) &&
              (local_e28.d[2] == 0 && local_e28.d[0] == 0)) {
            return 0;
          }
          if (a->infinity != 0) {
            return 0;
          }
          if (local_e30 != (secp256k1_scalar *)0x0) {
            psVar4->d[2] = local_e28.d[2];
            psVar4->d[3] = local_e28.d[3];
            psVar4->d[0] = local_e28.d[0];
            psVar4->d[1] = local_e28.d[1];
          }
          local_dd8.zr = local_178;
          local_dd8.pre_a = local_838;
          local_dd8.ps = &local_c48;
          local_de8 = psVar4;
          secp256k1_ecmult_strauss_wnaf(local_df0,&local_dd8,&local_d20,1,a,&local_e28,ng);
          if (local_d20.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_ca0,&local_d20);
          sVar6 = local_e38;
          secp256k1_eckey_pubkey_serialize(&local_ca0,&local_db8,&local_de0,1);
          if (uVar5 == rsizes[sVar6] - 1) {
            secp256k1_sha256_write(&local_d88,&local_db8,local_de0);
            uVar3 = extraout_RAX_00;
          }
          else {
            local_c48.wnaf_na[0] = 0x6a09e667;
            local_c48.wnaf_na[1] = -0x4498517b;
            local_c48.wnaf_na[2] = 0x3c6ef372;
            local_c48.wnaf_na[3] = -0x5ab00ac6;
            local_c48.wnaf_na[4] = 0x510e527f;
            local_c48.wnaf_na[5] = -0x64fa9774;
            local_c48.wnaf_na[6] = 0x1f83d9ab;
            local_c48.wnaf_na[7] = 0x5be0cd19;
            local_c48.wnaf_na[0x18] = 0;
            local_c48.wnaf_na[0x19] = 0;
            local_578[0].x.n[0]._0_4_ = local_e44;
            uVar2 = (int)uVar5 + 1;
            local_838[0].x.n[0]._0_4_ =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 * 0x1000000
            ;
            secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,&local_db8,0x21);
            secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,m,mlen);
            secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_578,4);
            secp256k1_sha256_write((secp256k1_sha256 *)&local_c48,(uchar *)local_838,4);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&local_c48,&local_db8);
            secp256k1_scalar_set_b32(&local_e28,&local_db8,&local_e48);
            uVar3 = extraout_RAX_01;
          }
          uVar5 = uVar5 + 1;
          ng = ng + 1;
          a = a + 1;
          psVar4 = local_de8 + 1;
        } while (uVar5 < rsizes[sVar6]);
        local_e40 = local_e40 + uVar5;
        e0 = local_e08;
      }
      sVar6 = local_e38 + 1;
    } while (sVar6 != nrings);
  }
  secp256k1_sha256_write(&local_d88,m,mlen);
  secp256k1_sha256_finalize(&local_d88,&local_db8);
  auVar7[0] = -(e0[0x10] == local_da8);
  auVar7[1] = -(e0[0x11] == uStack_da7);
  auVar7[2] = -(e0[0x12] == uStack_da6);
  auVar7[3] = -(e0[0x13] == uStack_da5);
  auVar7[4] = -(e0[0x14] == uStack_da4);
  auVar7[5] = -(e0[0x15] == uStack_da3);
  auVar7[6] = -(e0[0x16] == uStack_da2);
  auVar7[7] = -(e0[0x17] == uStack_da1);
  auVar7[8] = -(e0[0x18] == uStack_da0);
  auVar7[9] = -(e0[0x19] == uStack_d9f);
  auVar7[10] = -(e0[0x1a] == uStack_d9e);
  auVar7[0xb] = -(e0[0x1b] == uStack_d9d);
  auVar7[0xc] = -(e0[0x1c] == uStack_d9c);
  auVar7[0xd] = -(e0[0x1d] == uStack_d9b);
  auVar7[0xe] = -(e0[0x1e] == uStack_d9a);
  auVar7[0xf] = -(e0[0x1f] == uStack_d99);
  auVar9[0] = -(*e0 == local_db8);
  auVar9[1] = -(e0[1] == uStack_db7);
  auVar9[2] = -(e0[2] == uStack_db6);
  auVar9[3] = -(e0[3] == uStack_db5);
  auVar9[4] = -(e0[4] == uStack_db4);
  auVar9[5] = -(e0[5] == uStack_db3);
  auVar9[6] = -(e0[6] == uStack_db2);
  auVar9[7] = -(e0[7] == uStack_db1);
  auVar9[8] = -(e0[8] == uStack_db0);
  auVar9[9] = -(e0[9] == uStack_daf);
  auVar9[10] = -(e0[10] == uStack_dae);
  auVar9[0xb] = -(e0[0xb] == uStack_dad);
  auVar9[0xc] = -(e0[0xc] == uStack_dac);
  auVar9[0xd] = -(e0[0xd] == uStack_dab);
  auVar9[0xe] = -(e0[0xe] == uStack_daa);
  auVar9[0xf] = -(e0[0xf] == uStack_da9);
  auVar9 = auVar9 & auVar7;
  return (uint)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff);
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}